

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O3

void anon_unknown.dwarf_bda6::fillChannels(Rand48 *random,FlatImageLevel *level)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  uint uVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ushort uVar15;
  float fVar16;
  double dVar17;
  
  p_Var9 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::begin();
  do {
    p_Var10 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::end();
    if (p_Var9 == p_Var10) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"             channel ",0x15);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    iVar5 = (**(code **)**(undefined8 **)(p_Var9 + 2))();
    if (iVar5 == 0) {
      lVar12 = __dynamic_cast(*(undefined8 *)(p_Var9 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                              &Imf_3_4::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
      if (lVar12 == 0) goto LAB_00107e41;
      lVar3 = *(long *)(lVar12 + 8);
      iVar5 = *(int *)(lVar3 + 0x1c);
      iVar6 = *(int *)(lVar3 + 0x24);
      if (iVar5 <= iVar6) {
        iVar1 = *(int *)(lVar12 + 0x10);
        iVar2 = *(int *)(lVar12 + 0x14);
        iVar13 = *(int *)(lVar3 + 0x20);
        do {
          iVar14 = *(int *)(lVar3 + 0x18);
          if (iVar14 <= iVar13) {
            do {
              dVar17 = (double)Imath_3_2::erand48(random->_state);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar12,iVar14);
              *(int *)(*(long *)(lVar12 + 0x38) +
                      (long)(iVar14 / *(int *)(lVar12 + 0x10) +
                            (iVar5 / *(int *)(lVar12 + 0x14)) * *(int *)(lVar12 + 0x1c)) * 4) =
                   (int)(long)((1.0 - dVar17) * 0.0 + dVar17 * 100.0);
              iVar14 = iVar14 + iVar1;
              iVar13 = *(int *)(lVar3 + 0x20);
            } while (iVar14 <= iVar13);
            iVar6 = *(int *)(lVar3 + 0x24);
          }
          iVar5 = iVar5 + iVar2;
        } while (iVar5 <= iVar6);
      }
    }
    else if (iVar5 == 2) {
      lVar12 = __dynamic_cast(*(undefined8 *)(p_Var9 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                              &Imf_3_4::TypedFlatImageChannel<float>::typeinfo,0);
      if (lVar12 == 0) goto LAB_00107e41;
      lVar3 = *(long *)(lVar12 + 8);
      iVar5 = *(int *)(lVar3 + 0x1c);
      iVar6 = *(int *)(lVar3 + 0x24);
      if (iVar5 <= iVar6) {
        iVar1 = *(int *)(lVar12 + 0x10);
        iVar2 = *(int *)(lVar12 + 0x14);
        iVar13 = *(int *)(lVar3 + 0x20);
        do {
          iVar14 = *(int *)(lVar3 + 0x18);
          if (iVar14 <= iVar13) {
            do {
              dVar17 = (double)Imath_3_2::erand48(random->_state);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar12,iVar14);
              *(float *)(*(long *)(lVar12 + 0x38) +
                        (long)(iVar14 / *(int *)(lVar12 + 0x10) +
                              (iVar5 / *(int *)(lVar12 + 0x14)) * *(int *)(lVar12 + 0x1c)) * 4) =
                   (float)((1.0 - dVar17) * 0.0 + dVar17 * 100.0);
              iVar14 = iVar14 + iVar1;
              iVar13 = *(int *)(lVar3 + 0x20);
            } while (iVar14 <= iVar13);
            iVar6 = *(int *)(lVar3 + 0x24);
          }
          iVar5 = iVar5 + iVar2;
        } while (iVar5 <= iVar6);
      }
    }
    else {
      if (iVar5 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                      ,0xc9,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImageLevel &)");
      }
      lVar12 = __dynamic_cast(*(undefined8 *)(p_Var9 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                              &Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
      if (lVar12 == 0) {
LAB_00107e41:
        __cxa_bad_cast();
      }
      lVar3 = *(long *)(lVar12 + 8);
      iVar5 = *(int *)(lVar3 + 0x1c);
      iVar6 = *(int *)(lVar3 + 0x24);
      if (iVar5 <= iVar6) {
        iVar1 = *(int *)(lVar12 + 0x10);
        iVar2 = *(int *)(lVar12 + 0x14);
        iVar13 = *(int *)(lVar3 + 0x20);
        do {
          iVar14 = *(int *)(lVar3 + 0x18);
          if (iVar14 <= iVar13) {
            do {
              dVar17 = (double)Imath_3_2::erand48(random->_state);
              fVar16 = (float)((1.0 - dVar17) * 0.0 + dVar17 * 100.0);
              fVar7 = ABS(fVar16);
              uVar15 = (ushort)((uint)fVar16 >> 0x10) & 0x8000;
              if ((uint)fVar7 < 0x38800000) {
                if ((0x33000000 < (uint)fVar7) &&
                   (uVar8 = (uint)fVar7 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar7 >> 0x17),
                   uVar15 = uVar15 | (ushort)(uVar8 >> (0x7eU - cVar4 & 0x1f)),
                   0x80000000 < uVar8 << (cVar4 + 0xa2U & 0x1f))) {
                  uVar15 = uVar15 + 1;
                }
              }
              else if ((uint)fVar7 < 0x7f800000) {
                if ((uint)fVar7 < 0x477ff000) {
                  uVar15 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0)
                                   >> 0xd) | uVar15;
                }
                else {
                  uVar15 = uVar15 | 0x7c00;
                }
              }
              else {
                uVar15 = uVar15 | 0x7c00;
                if (fVar7 != INFINITY) {
                  uVar8 = (uint)fVar7 >> 0xd & 0x3ff;
                  uVar15 = uVar15 | (ushort)uVar8 | (ushort)(uVar8 == 0);
                }
              }
              Imf_3_4::ImageChannel::boundsCheck((int)lVar12,iVar14);
              *(ushort *)
               (*(long *)(lVar12 + 0x38) +
               (long)(iVar14 / *(int *)(lVar12 + 0x10) +
                     (iVar5 / *(int *)(lVar12 + 0x14)) * *(int *)(lVar12 + 0x1c)) * 2) = uVar15;
              iVar14 = iVar14 + iVar1;
              iVar13 = *(int *)(lVar3 + 0x20);
            } while (iVar14 <= iVar13);
            iVar6 = *(int *)(lVar3 + 0x24);
          }
          iVar5 = iVar5 + iVar2;
        } while (iVar5 <= iVar6);
      }
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

void
fillChannels (Rand48& random, FlatImageLevel& level)
{
    for (FlatImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}